

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

BitWidth __thiscall
flexbuffers::Builder::Value::ElemWidth(Value *this,size_t buf_size,size_t elem_index)

{
  bool bVar1;
  size_t sVar2;
  BitWidth bit_width;
  unsigned_long offset;
  size_t offset_loc;
  size_t byte_width;
  size_t elem_index_local;
  size_t buf_size_local;
  Value *this_local;
  
  bVar1 = IsInline(this->type_);
  if (bVar1) {
    this_local._4_4_ = this->min_bit_width_;
  }
  else {
    offset_loc = 1;
    while( true ) {
      if (8 < offset_loc) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                      ,0x60d,"BitWidth flexbuffers::Builder::Value::ElemWidth(size_t, size_t) const"
                     );
      }
      sVar2 = flatbuffers::PaddingBytes(buf_size,offset_loc);
      this_local._4_4_ = WidthU((buf_size + sVar2 + elem_index * offset_loc) - (this->field_0).i_);
      if (1L << ((byte)this_local._4_4_ & 0x3f) == offset_loc) break;
      offset_loc = offset_loc << 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BitWidth ElemWidth(size_t buf_size, size_t elem_index) const {
      if (IsInline(type_)) {
        return min_bit_width_;
      } else {
        // We have an absolute offset, but want to store a relative offset
        // elem_index elements beyond the current buffer end. Since whether
        // the relative offset fits in a certain byte_width depends on
        // the size of the elements before it (and their alignment), we have
        // to test for each size in turn.
        for (size_t byte_width = 1;
             byte_width <= sizeof(flatbuffers::largest_scalar_t);
             byte_width *= 2) {
          // Where are we going to write this offset?
          auto offset_loc = buf_size +
                            flatbuffers::PaddingBytes(buf_size, byte_width) +
                            elem_index * byte_width;
          // Compute relative offset.
          auto offset = offset_loc - u_;
          // Does it fit?
          auto bit_width = WidthU(offset);
          if (static_cast<size_t>(static_cast<size_t>(1U) << bit_width) ==
              byte_width)
            return bit_width;
        }
        FLATBUFFERS_ASSERT(false);  // Must match one of the sizes above.
        return BIT_WIDTH_64;
      }
    }